

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O0

void PrintByteCount(int *bytes,int total_size,int *totals)

{
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int total;
  int s;
  uint local_20;
  int local_1c;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    fprintf(stderr,"| %7d ",(ulong)*(uint *)(in_RDI + (long)local_1c * 4));
    local_20 = *(int *)(in_RDI + (long)local_1c * 4) + local_20;
    if (in_RDX != 0) {
      *(int *)(in_RDX + (long)local_1c * 4) =
           *(int *)(in_RDI + (long)local_1c * 4) + *(int *)(in_RDX + (long)local_1c * 4);
    }
  }
  fprintf(stderr,"| %7d  (%.1f%%)\n",(double)(((float)(int)local_20 * 100.0) / (float)in_ESI),
          (ulong)local_20);
  return;
}

Assistant:

static void PrintByteCount(const int bytes[4], int total_size,
                           int* const totals) {
  int s;
  int total = 0;
  for (s = 0; s < 4; ++s) {
    fprintf(stderr, "| %7d ", bytes[s]);
    total += bytes[s];
    if (totals) totals[s] += bytes[s];
  }
  fprintf(stderr, "| %7d  (%.1f%%)\n", total, 100.f * total / total_size);
}